

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall Catch::Matchers::WithinUlpsMatcher::match(WithinUlpsMatcher *this,double *matchee)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  ReusableStringStream RStack_48;
  string local_38;
  SourceLineInfo local_18;
  
  if (this->m_type == Double) {
    dVar1 = *matchee;
    dVar2 = this->m_target;
    if (NAN(dVar1) || NAN(dVar2)) {
      return false;
    }
    if (-1 < (long)((ulong)dVar2 ^ (ulong)dVar1)) {
      uVar6 = (long)dVar1 - (long)dVar2;
      uVar7 = -uVar6;
      if (0 < (long)uVar6) {
        uVar7 = uVar6;
      }
      return uVar7 <= this->m_ulps;
    }
    bVar3 = dVar1 == dVar2;
  }
  else {
    if (this->m_type != Float) {
      ReusableStringStream::ReusableStringStream(&RStack_48);
      local_18.file =
           "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.cpp"
      ;
      local_18.line = 0x19cd;
      Catch::operator<<(RStack_48.m_oss,&local_18);
      std::operator<<(RStack_48.m_oss,": Internal Catch2 error: ");
      std::operator<<(RStack_48.m_oss,"Unknown Detail::FloatingPointKind value");
      std::__cxx11::stringbuf::str();
      throw_logic_error(&local_38);
    }
    fVar8 = (float)*matchee;
    fVar9 = (float)this->m_target;
    if (NAN(fVar8) || NAN(fVar9)) {
      return false;
    }
    if (-1 < (int)((uint)fVar9 ^ (uint)fVar8)) {
      uVar5 = (int)fVar8 - (int)fVar9;
      uVar4 = -uVar5;
      if (0 < (int)uVar5) {
        uVar4 = uVar5;
      }
      return (ulong)uVar4 <= this->m_ulps;
    }
    bVar3 = fVar8 == fVar9;
  }
  return (bool)(-bVar3 & 1);
}

Assistant:

bool WithinUlpsMatcher::match(double const &matchee) const {
            switch (m_type) {
            case Detail::FloatingPointKind::Float:
                return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
            case Detail::FloatingPointKind::Double:
                return almostEqualUlps<double>(matchee, m_target, m_ulps);
            default:
                CATCH_INTERNAL_ERROR("Unknown Detail::FloatingPointKind value");
            }
        }